

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find.hpp
# Opt level: O2

key_iterator * __thiscall
trial::dynamic::key::find<std::allocator<char>,char[6]>
          (key_iterator *__return_storage_ptr__,key *this,
          basic_variable<std::allocator<char>_> *self,char (*other) [6])

{
  bool bVar1;
  value vVar2;
  const_reference lhs;
  key_iterator kStack_78;
  
  vVar2 = basic_variable<std::allocator<char>_>::symbol
                    ((basic_variable<std::allocator<char>_> *)this);
  if (vVar2 - boolean < 7) {
    bVar1 = detail::
            operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char[6],_void>
            ::equal((variable_type *)this,(char *)self);
    if (bVar1) {
      basic_variable<std::allocator<char>_>::key_begin
                (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)this);
      return __return_storage_ptr__;
    }
  }
  else if (vVar2 - array < 2) {
    basic_variable<std::allocator<char>_>::key_begin
              (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)this);
    while( true ) {
      basic_variable<std::allocator<char>_>::key_end
                (&kStack_78,(basic_variable<std::allocator<char>_> *)this);
      bVar1 = basic_variable<std::allocator<char>_>::key_iterator::operator!=
                        (__return_storage_ptr__,&kStack_78);
      basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&kStack_78);
      if (!bVar1) break;
      lhs = basic_variable<std::allocator<char>_>::key_iterator::key(__return_storage_ptr__);
      bVar1 = detail::
              operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char[6],_void>
              ::equal(lhs,(char *)self);
      if (bVar1) {
        return __return_storage_ptr__;
      }
      basic_variable<std::allocator<char>_>::key_iterator::operator++(__return_storage_ptr__);
    }
    basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(__return_storage_ptr__);
  }
  basic_variable<std::allocator<char>_>::key_end
            (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)this);
  return __return_storage_ptr__;
}

Assistant:

auto find(const basic_variable<Allocator>& self,
          const T& other) -> typename basic_variable<Allocator>::key_iterator
{
    switch (self.symbol())
    {
    case symbol::null:
        return self.key_end();

    case symbol::boolean:
    case symbol::integer:
    case symbol::real:
    case symbol::string:
    case symbol::wstring:
    case symbol::u16string:
    case symbol::u32string:
        return (self == other) ? self.key_begin() : self.key_end();

    case symbol::array:
    case symbol::map:
        for (auto it = self.key_begin(); it != self.key_end(); ++it)
        {
            if (*it == other)
                return it;
        }
        return self.key_end();
    }
    TRIAL_DYNAMIC_UNREACHABLE();
}